

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vertex_sequence.h
# Opt level: O0

int __thiscall
agg::vertex_sequence<agg::vertex_dist,_6U>::close
          (vertex_sequence<agg::vertex_dist,_6U> *this,int __fd)

{
  bool bVar1;
  uint uVar2;
  vertex_dist *pvVar3;
  vertex_dist *pvVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined1 local_30 [8];
  vertex_dist t;
  bool closed_local;
  vertex_sequence<agg::vertex_dist,_6U> *this_local;
  
  t.dist._7_1_ = (byte)__fd & 1;
  while (uVar2 = pod_bvector<agg::vertex_dist,_6U>::size
                           (&this->super_pod_bvector<agg::vertex_dist,_6U>), 1 < uVar2) {
    uVar2 = pod_bvector<agg::vertex_dist,_6U>::size(&this->super_pod_bvector<agg::vertex_dist,_6U>);
    pvVar3 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                       (&this->super_pod_bvector<agg::vertex_dist,_6U>,uVar2 - 2);
    uVar2 = pod_bvector<agg::vertex_dist,_6U>::size(&this->super_pod_bvector<agg::vertex_dist,_6U>);
    pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                       (&this->super_pod_bvector<agg::vertex_dist,_6U>,uVar2 - 1);
    bVar1 = vertex_dist::operator()(pvVar3,pvVar4);
    uVar2 = (uint)CONCAT71(extraout_var,bVar1);
    if (bVar1) break;
    uVar2 = pod_bvector<agg::vertex_dist,_6U>::size(&this->super_pod_bvector<agg::vertex_dist,_6U>);
    pvVar3 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                       (&this->super_pod_bvector<agg::vertex_dist,_6U>,uVar2 - 1);
    local_30 = (undefined1  [8])pvVar3->x;
    t.x = pvVar3->y;
    t.y = pvVar3->dist;
    pod_bvector<agg::vertex_dist,_6U>::remove_last(&this->super_pod_bvector<agg::vertex_dist,_6U>);
    modify_last(this,(vertex_dist *)local_30);
  }
  if ((t.dist._7_1_ & 1) != 0) {
    while (uVar2 = pod_bvector<agg::vertex_dist,_6U>::size
                             (&this->super_pod_bvector<agg::vertex_dist,_6U>), 1 < uVar2) {
      uVar2 = pod_bvector<agg::vertex_dist,_6U>::size
                        (&this->super_pod_bvector<agg::vertex_dist,_6U>);
      pvVar3 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         (&this->super_pod_bvector<agg::vertex_dist,_6U>,uVar2 - 1);
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         (&this->super_pod_bvector<agg::vertex_dist,_6U>,0);
      bVar1 = vertex_dist::operator()(pvVar3,pvVar4);
      if (bVar1) {
        return (int)CONCAT71(extraout_var_00,bVar1);
      }
      pod_bvector<agg::vertex_dist,_6U>::remove_last(&this->super_pod_bvector<agg::vertex_dist,_6U>)
      ;
    }
  }
  return uVar2;
}

Assistant:

void vertex_sequence<T, S>::close(bool closed)
    {
        while(base_type::size() > 1)
        {
            if((*this)[base_type::size() - 2]((*this)[base_type::size() - 1])) break;
            T t = (*this)[base_type::size() - 1];
            base_type::remove_last();
            modify_last(t);
        }

        if(closed)
        {
            while(base_type::size() > 1)
            {
                if((*this)[base_type::size() - 1]((*this)[0])) break;
                base_type::remove_last();
            }
        }
    }